

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsreader.cc
# Opt level: O2

bool fizplex::MPSReader::is_indicator(string *word)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  undefined **ppuVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  
  ppuVar4 = &PTR_anon_var_dwarf_c6911_001c23b8;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 4) break;
    __x._M_str = (word->_M_dataplus)._M_p;
    __x._M_len = word->_M_string_length;
    __y._M_str = *ppuVar4;
    __y._M_len = (size_t)ppuVar4[-1];
    bVar2 = std::operator==(__x,__y);
    ppuVar4 = ppuVar4 + 2;
    uVar1 = uVar3 + 1;
  } while (!bVar2);
  return uVar3 < 4;
}

Assistant:

bool is_indicator(const std::string &word) {
  for (int i = 0; i < indicator_count; ++i) {
    if (word == indicators[i])
      return true;
  }
  return false;
}